

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__Writer.cpp
# Opt level: O0

h__ASDCPWriter * __thiscall ASDCP::h__ASDCPWriter::WriteASDCPFooter(h__ASDCPWriter *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  reference ppuVar4;
  reference pvVar5;
  byte_t *value;
  long in_RSI;
  Result_t local_228 [104];
  undefined1 local_1c0 [208];
  undefined1 local_f0 [120];
  UL OPAtomUL;
  PartitionPair local_50;
  _func_int **local_38;
  fpos_t here;
  _Self local_28;
  _Self local_20;
  iterator dli;
  h__ASDCPWriter *this_local;
  Result_t *result;
  
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_long_long_*,_std::allocator<unsigned_long_long_*>_>::begin
                 ((list<unsigned_long_long_*,_std::allocator<unsigned_long_long_*>_> *)
                  (in_RSI + 0x428));
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_long_long_*,_std::allocator<unsigned_long_long_*>_>::end
                   ((list<unsigned_long_long_*,_std::allocator<unsigned_long_long_*>_> *)
                    (in_RSI + 0x428));
    bVar2 = std::operator!=(&local_20,&local_28);
    if (!bVar2) break;
    uVar1 = *(uint *)(in_RSI + 0x338);
    ppuVar4 = std::_List_iterator<unsigned_long_long_*>::operator*(&local_20);
    **ppuVar4 = (ulong)uVar1;
    std::_List_iterator<unsigned_long_long_*>::operator++(&local_20);
  }
  here = (fpos_t)*(uint *)(in_RSI + 0x338);
  MXF::optional_property<unsigned_long_long>::operator=
            ((optional_property<unsigned_long_long> *)(*(long *)(in_RSI + 0x318) + 0xf8),
             (unsigned_long_long *)&here);
  pvVar5 = std::__cxx11::
           list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::
           back((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                 *)(in_RSI + 0x2e8));
  *(ui64_t *)(in_RSI + 0x5f8) = pvVar5->ByteOffset;
  local_38 = (_func_int **)Kumu::IFileReader::TellPosition((IFileReader *)(in_RSI + 0x10));
  MXF::RIP::PartitionPair::PartitionPair(&local_50,0,(ui64_t)local_38);
  std::__cxx11::
  list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::push_back
            ((list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
              *)(in_RSI + 0x2e8),&local_50);
  MXF::RIP::PartitionPair::~PartitionPair(&local_50);
  *(_func_int ***)(in_RSI + 0xe8) = local_38;
  if (*(long *)(in_RSI + 8) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__Writer.cpp"
                  ,0x15e,"Result_t ASDCP::h__ASDCPWriter::WriteASDCPFooter()");
  }
  value = Dictionary::ul(*(Dictionary **)(in_RSI + 8),MDD_OPAtom);
  UL::UL((UL *)(local_f0 + 0x70),value);
  UL::operator=((UL *)(in_RSI + 0x118),(UL *)(local_f0 + 0x70));
  UL::operator=((UL *)(*(long *)(in_RSI + 0x260) + 0x130),(UL *)(local_f0 + 0x70));
  UL::operator=((UL *)(in_RSI + 0x630),(UL *)(local_f0 + 0x70));
  MXF::Batch<ASDCP::UL>::operator=
            ((Batch<ASDCP::UL> *)(in_RSI + 0x650),(Batch<ASDCP::UL> *)(in_RSI + 0x138));
  *(_func_int ***)(in_RSI + 0x600) = local_38;
  *(_func_int ***)(in_RSI + 0x5f0) = local_38;
  local_f0[0x6f] = 0;
  MXF::OPAtomIndexFooter::WriteToFile
            ((OPAtomIndexFooter *)this,(FileWriter *)(in_RSI + 0x568),in_RSI + 0x10);
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar3) {
    MXF::RIP::WriteToFile((RIP *)local_f0,(FileWriter *)(in_RSI + 0x268));
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_f0);
    Kumu::Result_t::~Result_t((Result_t *)local_f0);
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar3) {
    Kumu::FileReader::Seek((long)(local_1c0 + 0x68),(int)in_RSI + 0x10);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)(local_1c0 + 0x68));
    Kumu::Result_t::~Result_t((Result_t *)(local_1c0 + 0x68));
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar3) {
    MXF::OP1aHeader::WriteToFile
              ((OP1aHeader *)local_1c0,(FileWriter *)(in_RSI + 0x50),(int)in_RSI + 0x10);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_1c0);
    Kumu::Result_t::~Result_t((Result_t *)local_1c0);
  }
  Kumu::FileReader::Close();
  Kumu::Result_t::~Result_t(local_228);
  local_f0[0x6f] = 1;
  UL::~UL((UL *)(local_f0 + 0x70));
  return this;
}

Assistant:

Result_t
ASDCP::h__ASDCPWriter::WriteASDCPFooter()
{
  // update all Duration properties
  DurationElementList_t::iterator dli = m_DurationUpdateList.begin();

  for (; dli != m_DurationUpdateList.end(); ++dli )
    {
      **dli = m_FramesWritten;
    }

  m_EssenceDescriptor->ContainerDuration = m_FramesWritten;
  m_FooterPart.PreviousPartition = m_RIP.PairArray.back().ByteOffset;

  Kumu::fpos_t here = m_File.TellPosition();
  m_RIP.PairArray.push_back(RIP::PartitionPair(0, here)); // Last RIP Entry
  m_HeaderPart.FooterPartition = here;

  assert(m_Dict);
  // re-label the header partition, set the footer
  UL OPAtomUL(m_Dict->ul(MDD_OPAtom));
  m_HeaderPart.OperationalPattern = OPAtomUL;
  m_HeaderPart.m_Preface->OperationalPattern = OPAtomUL;
  m_FooterPart.OperationalPattern = OPAtomUL;

  m_FooterPart.EssenceContainers = m_HeaderPart.EssenceContainers;
  m_FooterPart.FooterPartition = here;
  m_FooterPart.ThisPartition = here;

  Result_t result = m_FooterPart.WriteToFile(m_File, m_FramesWritten);

  if ( ASDCP_SUCCESS(result) )
    result = m_RIP.WriteToFile(m_File);

  if ( ASDCP_SUCCESS(result) )
    result = m_File.Seek(0);

  if ( ASDCP_SUCCESS(result) )
    result = m_HeaderPart.WriteToFile(m_File, m_HeaderSize);

  m_File.Close();
  return result;
}